

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O2

uint32_t duckdb::DecodeBase64Bytes<true>(string_t *str,const_data_ptr_t input_data,idx_t base_idx)

{
  int iVar1;
  ulong uVar2;
  ConversionException *this;
  allocator local_79;
  int decoded_bytes [4];
  string local_68;
  string local_48;
  
  uVar2 = 0;
  do {
    if (uVar2 == 4) {
      return decoded_bytes[2] * 0x40 + decoded_bytes[1] * 0x1000 + decoded_bytes[0] * 0x40000 +
             decoded_bytes[3];
    }
    if (input_data[base_idx] == 0x3d && 1 < uVar2) {
      decoded_bytes[uVar2] = 0;
    }
    else {
      iVar1 = *(int *)(BASE64_DECODING_TABLE + (ulong)input_data[base_idx] * 4);
      decoded_bytes[uVar2] = iVar1;
      if (iVar1 < 0) {
        this = (ConversionException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_48,
                   "Could not decode string \"%s\" as base64: invalid byte value \'%d\' at position %d"
                   ,&local_79);
        string_t::GetString_abi_cxx11_(&local_68,str);
        ConversionException::ConversionException<std::__cxx11::string,unsigned_char,unsigned_long>
                  (this,&local_48,&local_68,input_data[base_idx],base_idx);
        __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    uVar2 = uVar2 + 1;
    base_idx = base_idx + 1;
  } while( true );
}

Assistant:

uint32_t DecodeBase64Bytes(const string_t &str, const_data_ptr_t input_data, idx_t base_idx) {
	int decoded_bytes[4];
	for (idx_t decode_idx = 0; decode_idx < 4; decode_idx++) {
		if (ALLOW_PADDING && decode_idx >= 2 && input_data[base_idx + decode_idx] == Blob::BASE64_PADDING) {
			// the last two bytes of a base64 string can have padding: in this case we set the byte to 0
			decoded_bytes[decode_idx] = 0;
		} else {
			decoded_bytes[decode_idx] = BASE64_DECODING_TABLE[input_data[base_idx + decode_idx]];
		}
		if (decoded_bytes[decode_idx] < 0) {
			throw ConversionException(
			    "Could not decode string \"%s\" as base64: invalid byte value '%d' at position %d", str.GetString(),
			    input_data[base_idx + decode_idx], base_idx + decode_idx);
		}
	}
	return UnsafeNumericCast<uint32_t>((decoded_bytes[0] << 3 * 6) + (decoded_bytes[1] << 2 * 6) +
	                                   (decoded_bytes[2] << 1 * 6) + (decoded_bytes[3] << 0 * 6));
}